

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::vSolveUrightNoNZ
          (CLUFactor<double> *this,double *vec,double *rhs,int *ridx,int rn,double eps)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  pointer pdVar7;
  int *piVar8;
  int *piVar9;
  pointer pdVar10;
  bool bVar11;
  int *piVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  double *pdVar22;
  double dVar23;
  double dVar24;
  
  if (0 < rn) {
    piVar3 = (this->row).orig;
    piVar4 = (this->row).perm;
    piVar5 = (this->col).orig;
    piVar6 = (this->u).col.idx;
    pdVar7 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->u).col.len;
    piVar9 = (this->u).col.start;
    pdVar10 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar14 = *ridx;
      if ((double)(int)uVar14 * 0.2 < (double)rn) {
        if ((int)uVar14 < 0) {
          return;
        }
        pdVar10 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = (ulong)uVar14;
        do {
          iVar1 = piVar3[uVar13];
          dVar23 = pdVar10[iVar1] * rhs[iVar1];
          rhs[iVar1] = 0.0;
          if (eps < ABS(dVar23)) {
            iVar1 = piVar5[uVar13];
            vec[iVar1] = dVar23;
            iVar16 = piVar8[iVar1];
            if (0 < iVar16) {
              lVar17 = (long)piVar9[iVar1] << 2;
              iVar16 = iVar16 + 1;
              do {
                iVar1 = *(int *)((long)piVar6 + lVar17);
                rhs[iVar1] = rhs[iVar1] - *(double *)((long)pdVar7 + lVar17 * 2) * dVar23;
                lVar17 = lVar17 + 4;
                iVar16 = iVar16 + -1;
              } while (1 < iVar16);
            }
          }
          bVar11 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar11);
        return;
      }
      uVar20 = rn - 1;
      uVar13 = (ulong)uVar20;
      iVar1 = ridx[(long)rn + -1];
      if (rn < 4) {
        iVar16 = 1;
        iVar18 = 0;
      }
      else {
        iVar18 = 0;
        iVar16 = 1;
        do {
          iVar2 = ridx[iVar16];
          iVar21 = ridx[(long)iVar16 + 1];
          piVar12 = ridx + iVar18;
          if (iVar21 < iVar2) {
            iVar18 = iVar16;
            iVar21 = iVar2;
            if (iVar2 <= iVar1) goto LAB_001e17be;
          }
          else {
            if (iVar21 <= iVar1) goto LAB_001e17be;
            iVar18 = iVar16 + 1;
          }
          *piVar12 = iVar21;
          iVar16 = iVar18 * 2 + 1;
        } while (iVar16 < (int)(rn - 2U));
      }
      if ((iVar16 < (int)uVar20) && (iVar1 < ridx[iVar16])) {
        ridx[iVar18] = ridx[iVar16];
        iVar18 = iVar16;
      }
      piVar12 = ridx + iVar18;
LAB_001e17be:
      *piVar12 = iVar1;
      iVar1 = piVar3[(int)uVar14];
      dVar23 = pdVar10[iVar1] * rhs[iVar1];
      rhs[iVar1] = 0.0;
      rn = uVar20;
      if (eps < ABS(dVar23)) {
        iVar1 = piVar5[(int)uVar14];
        vec[iVar1] = dVar23;
        iVar16 = piVar8[iVar1];
        if (0 < iVar16) {
          iVar1 = piVar9[iVar1];
          piVar12 = piVar6 + iVar1;
          pdVar22 = pdVar7 + iVar1;
          do {
            uVar14 = (uint)uVar13;
            iVar1 = *piVar12;
            dVar24 = rhs[iVar1];
            if ((dVar24 != 0.0) || (NAN(dVar24))) {
              dVar24 = dVar24 - *pdVar22 * dVar23;
              rhs[iVar1] = (double)(-(ulong)(dVar24 == 0.0) & 0x2b2bff2ee48e0530) + dVar24;
            }
            else {
              dVar24 = *pdVar22 * -dVar23;
              if (eps < ABS(dVar24)) {
                rhs[iVar1] = dVar24;
                iVar1 = piVar4[iVar1];
                uVar20 = uVar14;
                if (0 < (int)uVar14) {
                  do {
                    uVar15 = (uint)uVar13 - 1;
                    uVar19 = uVar15 >> 1;
                    uVar20 = (uint)uVar13;
                    if (iVar1 <= ridx[uVar19]) break;
                    ridx[uVar13] = ridx[uVar19];
                    uVar13 = (ulong)uVar19;
                    uVar20 = uVar19;
                  } while (1 < uVar15);
                }
                uVar13 = (ulong)(uVar14 + 1);
                ridx[(int)uVar20] = iVar1;
              }
            }
            rn = (int)uVar13;
            piVar12 = piVar12 + 1;
            pdVar22 = pdVar22 + 1;
            bVar11 = 1 < iVar16;
            iVar16 = iVar16 + -1;
          } while (bVar11);
        }
      }
    } while (0 < rn);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}